

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

auto_ptr<cmFileListGeneratorBase> __thiscall
cmFileListGeneratorFixed::Clone(cmFileListGeneratorFixed *this)

{
  cmFileListGeneratorFixed *this_00;
  cmFileListGeneratorFixed *in_RSI;
  
  this_00 = (cmFileListGeneratorFixed *)operator_new(0x30);
  cmFileListGeneratorFixed(this_00,in_RSI);
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase = (_func_int **)this_00;
  return (auto_ptr<cmFileListGeneratorBase>)&this->super_cmFileListGeneratorBase;
}

Assistant:

virtual cmsys::auto_ptr<cmFileListGeneratorBase> Clone() const
    {
    cmsys::auto_ptr<cmFileListGeneratorBase>
      g(new cmFileListGeneratorFixed(*this));
    return g;
    }